

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

void __thiscall SQVM::LeaveFrame(SQVM *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  SQTable *pSVar8;
  SQObjectPtr *pSVar9;
  long *plVar10;
  CallInfo *pCVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  lVar5 = this->_top;
  lVar6 = this->_stackbase;
  lVar7 = this->_callsstacksize;
  lVar13 = lVar7 + -1;
  this->_callsstacksize = lVar13;
  pCVar11 = this->ci;
  pSVar8 = (pCVar11->_closure).super_SQObject._unVal.pTable;
  SVar3 = (pCVar11->_closure).super_SQObject._type;
  (pCVar11->_closure).super_SQObject._type = OT_NULL;
  (pCVar11->_closure).super_SQObject._unVal.pTable = (SQTable *)0x0;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  lVar12 = this->_stackbase - (long)this->ci->_prevstkbase;
  this->_stackbase = lVar12;
  lVar12 = this->ci->_prevtop + lVar12;
  pCVar11 = this->_callsstack + lVar7 + -2;
  if (lVar13 == 0) {
    pCVar11 = (CallInfo *)0x0;
  }
  this->_top = lVar12;
  this->ci = pCVar11;
  if (this->_openouters != (SQOuter *)0x0) {
    CloseOuters(this,(this->_stack)._vals + lVar6);
    lVar12 = this->_top;
  }
  if (lVar12 <= lVar5) {
    lVar13 = lVar5 + 1;
    uVar14 = lVar5 << 4 | 8;
    do {
      pSVar9 = (this->_stack)._vals;
      plVar10 = *(long **)((long)&(pSVar9->super_SQObject)._type + uVar14);
      uVar4 = *(uint *)((long)pSVar9 + (uVar14 - 8));
      *(undefined4 *)((long)pSVar9 + (uVar14 - 8)) = 0x1000001;
      *(undefined8 *)((long)&(pSVar9->super_SQObject)._type + uVar14) = 0;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
      lVar13 = lVar13 + -1;
      uVar14 = uVar14 - 0x10;
    } while (this->_top < lVar13);
  }
  return;
}

Assistant:

void SQVM::LeaveFrame() {
    SQInteger last_top = _top;
    SQInteger last_stackbase = _stackbase;
    SQInteger css = --_callsstacksize;

    /* First clean out the call stack frame */
    ci->_closure.Null();
    _stackbase -= ci->_prevstkbase;
    _top = _stackbase + ci->_prevtop;
    ci = (css) ? &_callsstack[css-1] : NULL;

    if(_openouters) CloseOuters(&(_stack._vals[last_stackbase]));
    while (last_top >= _top) {
        _stack._vals[last_top--].Null();
    }
}